

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.cc
# Opt level: O1

bool __thiscall verona::lookup_type(verona *this,Node *id,initializer_list<trieste::Token> t)

{
  element_type **ppeVar1;
  Token *pTVar2;
  bool bVar3;
  Lookups defs;
  Node local_68;
  Node local_58;
  _Rb_tree<verona::Lookup,_verona::Lookup,_std::_Identity<verona::Lookup>,_std::less<verona::Lookup>,_std::allocator<verona::Lookup>_>
  local_40;
  
  local_68.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)this;
  local_68.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
  if (local_68.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_68.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_68.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_68.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_68.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  local_58.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_58.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  lookup((Lookups *)&local_40,&local_68,&local_58);
  if (local_58.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if (local_68.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if (local_40._M_impl.super__Rb_tree_header._M_node_count == 1) {
    ppeVar1 = &(id->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
              (long)t._M_array;
    pTVar2 = ::std::
             __find_if<trieste::Token_const*,__gnu_cxx::__ops::_Iter_equals_val<trieste::Token_const>>
                       (id,ppeVar1,
                        *(long *)(local_40._M_impl.super__Rb_tree_header._M_header._M_left + 1) +
                        0x10);
    bVar3 = pTVar2 != (Token *)ppeVar1;
  }
  else {
    bVar3 = false;
  }
  ::std::
  _Rb_tree<verona::Lookup,_verona::Lookup,_std::_Identity<verona::Lookup>,_std::less<verona::Lookup>,_std::allocator<verona::Lookup>_>
  ::~_Rb_tree(&local_40);
  return bVar3;
}

Assistant:

bool lookup_type(Node id, std::initializer_list<Token> t)
  {
    auto defs = lookup(id, {});
    return (defs.size() == 1) && defs.begin()->def->in(t);
  }